

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int accessPayload(BtCursor *pCur,u32 offset,u32 amt,uchar *pBuf,int eOp)

{
  ushort uVar1;
  uint uVar2;
  undefined4 uVar3;
  MemPage *pMVar4;
  BtShared *pBt;
  u8 *puVar5;
  Pager *pPVar6;
  sqlite3_file *psVar7;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  u32 uVar12;
  Pgno *pPVar13;
  undefined8 uVar14;
  long lVar15;
  u32 uVar16;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  long in_FS_OFFSET;
  DbPage *pDbPage;
  Pgno nextPage;
  uchar *local_70;
  DbPage *local_48;
  uint local_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pMVar4 = pCur->pPage;
  uVar14 = 0x12868;
  if (pCur->ix < pMVar4->nCell) {
    pBt = pCur->pBt;
    getCellInfo(pCur);
    puVar5 = (pCur->info).pPayload;
    uVar1 = (pCur->info).nLocal;
    uVar10 = (uint)uVar1;
    uVar14 = 0x12877;
    if ((ulong)((long)puVar5 - (long)pMVar4->aData) <= (ulong)(pBt->usableSize - uVar10)) {
      if (uVar10 < offset || uVar10 - offset == 0) {
        uVar19 = (ulong)(offset - uVar1);
        iVar11 = 0;
        local_70 = pBuf;
      }
      else {
        uVar16 = uVar10 - offset;
        if (amt + offset <= (uint)uVar1) {
          uVar16 = amt;
        }
        iVar11 = copyPayload(puVar5 + offset,pBuf,uVar16,eOp,pMVar4->pDbPage);
        local_70 = pBuf + (int)uVar16;
        amt = amt - uVar16;
        uVar19 = 0;
      }
      if ((iVar11 == 0) && (amt != 0)) {
        uVar10 = pBt->usableSize - 4;
        uVar1 = (pCur->info).nLocal;
        uVar2 = *(uint *)(puVar5 + uVar1);
        local_3c = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
        if ((pCur->curFlags & 4) == 0) {
          uVar2 = (((pBt->usableSize - (uint)uVar1) + (pCur->info).nPayload) - 5) / uVar10;
          if ((pCur->aOverflow != (Pgno *)0x0) &&
             (iVar11 = (*sqlite3Config.m.xSize)(pCur->aOverflow), (int)(uVar2 * 4) <= iVar11)) {
LAB_00140851:
            lVar15 = 0;
            memset(pCur->aOverflow,0,(long)(int)uVar2 << 2);
            pCur->curFlags = pCur->curFlags | 4;
            goto LAB_00140876;
          }
          if ((sqlite3Config.xTestCallback == (_func_int_int *)0x0) ||
             (iVar11 = (*sqlite3Config.xTestCallback)(0x19d), iVar11 == 0)) {
            pPVar13 = (Pgno *)sqlite3Realloc(pCur->aOverflow,(long)(int)(uVar2 * 2) << 2);
          }
          else {
            pPVar13 = (Pgno *)0x0;
          }
          if (pPVar13 != (Pgno *)0x0) {
            pCur->aOverflow = pPVar13;
            goto LAB_00140851;
          }
          iVar17 = 7;
          iVar11 = 0;
          bVar9 = false;
        }
        else {
          uVar8 = uVar19 / uVar10;
          lVar15 = 0;
          if (pCur->aOverflow[uVar8] != 0) {
            lVar15 = (long)(int)uVar8;
            local_3c = pCur->aOverflow[lVar15];
            uVar19 = uVar19 % (ulong)uVar10;
          }
LAB_00140876:
          if (local_3c != 0) {
            lVar15 = lVar15 * 4;
            do {
              uVar2 = local_3c;
              if (pBt->nPage < local_3c) {
                iVar11 = 0;
                sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x128be,
                            "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
                iVar17 = 0xb;
LAB_00140ada:
                bVar9 = false;
                goto LAB_00140aeb;
              }
              pPVar13 = pCur->aOverflow;
              *(uint *)((long)pPVar13 + lVar15) = local_3c;
              uVar18 = (uint)uVar19;
              if (uVar18 < uVar10) {
                uVar16 = uVar10 - uVar18;
                if (amt + uVar18 <= uVar10) {
                  uVar16 = amt;
                }
                if (((eOp == 0 && uVar18 == 0) &&
                    (pPVar6 = pBt->pPager, pPVar6->fd->pMethods != (sqlite3_io_methods *)0x0)) &&
                   (pPVar6->pPCache->pDirty == (PgHdr *)0x0)) {
                  if (pPVar6->pWal != (Wal *)0x0) {
                    local_48 = (DbPage *)((ulong)local_48 & 0xffffffff00000000);
                    walFindFrame(pPVar6->pWal,local_3c,(u32 *)&local_48);
                    if ((int)local_48 != 0) goto LAB_001408f5;
                  }
                  iVar11 = (*pPVar6->fd->pMethods->xDeviceCharacteristics)(pPVar6->fd);
                  if ((-1 < (short)iVar11) || (local_70 + -4 < pBuf)) goto LAB_001408f5;
                  psVar7 = pBt->pPager->fd;
                  uVar3 = *(undefined4 *)(local_70 + -4);
                  iVar11 = (*psVar7->pMethods->xRead)
                                     (psVar7,local_70 + -4,uVar16 + 4,
                                      (ulong)(uVar2 - 1) * (ulong)pBt->pageSize);
                  uVar2 = *(uint *)(local_70 + -4);
                  local_3c = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                             uVar2 << 0x18;
                  *(undefined4 *)(local_70 + -4) = uVar3;
                  uVar19 = 0;
                }
                else {
LAB_001408f5:
                  local_48 = (DbPage *)&DAT_aaaaaaaaaaaaaaaa;
                  iVar11 = (*pBt->pPager->xGet)(pBt->pPager,uVar2,&local_48,(uint)(eOp == 0) * 2);
                  if (iVar11 == 0) {
                    uVar2 = *local_48->pData;
                    local_3c = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 |
                               uVar2 << 0x18;
                    iVar11 = copyPayload((void *)((ulong)(uVar18 + 4) + (long)local_48->pData),
                                         local_70,uVar16,eOp,local_48);
                    uVar19 = 0;
                    if (local_48 != (DbPage *)0x0) {
                      sqlite3PagerUnrefNotNull(local_48);
                    }
                  }
                }
                uVar12 = uVar16;
                if (amt == uVar16) {
                  uVar12 = 0;
                }
                amt = amt - uVar16;
                iVar17 = iVar11;
                if (amt == 0) goto LAB_00140ada;
                local_70 = local_70 + (int)uVar12;
              }
              else {
                uVar2 = *(uint *)((long)pPVar13 + lVar15 + 4);
                if (uVar2 == 0) {
                  iVar11 = getOverflowPage(pBt,local_3c,(MemPage **)0x0,&local_3c);
                }
                else {
                  iVar11 = 0;
                  local_3c = uVar2;
                }
                uVar19 = (ulong)(uVar18 - uVar10);
              }
              if (iVar11 != 0) goto LAB_00140aa2;
              lVar15 = lVar15 + 4;
            } while (local_3c != 0);
          }
          iVar11 = 0;
LAB_00140aa2:
          iVar17 = 7;
          bVar9 = true;
        }
LAB_00140aeb:
        if (!bVar9) goto LAB_00140b27;
      }
      iVar17 = iVar11;
      if ((iVar11 != 0) || (uVar14 = 0x12912, amt == 0)) goto LAB_00140b27;
    }
  }
  sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar14,
              "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
  iVar17 = 0xb;
LAB_00140b27:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar17;
  }
  __stack_chk_fail();
}

Assistant:

static int accessPayload(
  BtCursor *pCur,      /* Cursor pointing to entry to read from */
  u32 offset,          /* Begin reading this far into payload */
  u32 amt,             /* Read this many bytes */
  unsigned char *pBuf, /* Write the bytes into this buffer */
  int eOp              /* zero to read. non-zero to write. */
){
  unsigned char *aPayload;
  int rc = SQLITE_OK;
  int iIdx = 0;
  MemPage *pPage = pCur->pPage;               /* Btree page of current entry */
  BtShared *pBt = pCur->pBt;                  /* Btree this cursor belongs to */
#ifdef SQLITE_DIRECT_OVERFLOW_READ
  unsigned char * const pBufStart = pBuf;     /* Start of original out buffer */
#endif

  assert( pPage );
  assert( eOp==0 || eOp==1 );
  assert( pCur->eState==CURSOR_VALID );
  if( pCur->ix>=pPage->nCell ){
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  assert( cursorHoldsMutex(pCur) );

  getCellInfo(pCur);
  aPayload = pCur->info.pPayload;
  assert( offset+amt <= pCur->info.nPayload );

  assert( aPayload > pPage->aData );
  if( (uptr)(aPayload - pPage->aData) > (pBt->usableSize - pCur->info.nLocal) ){
    /* Trying to read or write past the end of the data is an error.  The
    ** conditional above is really:
    **    &aPayload[pCur->info.nLocal] > &pPage->aData[pBt->usableSize]
    ** but is recast into its current form to avoid integer overflow problems
    */
    return SQLITE_CORRUPT_PAGE(pPage);
  }

  /* Check if data must be read/written to/from the btree page itself. */
  if( offset<pCur->info.nLocal ){
    int a = amt;
    if( a+offset>pCur->info.nLocal ){
      a = pCur->info.nLocal - offset;
    }
    rc = copyPayload(&aPayload[offset], pBuf, a, eOp, pPage->pDbPage);
    offset = 0;
    pBuf += a;
    amt -= a;
  }else{
    offset -= pCur->info.nLocal;
  }


  if( rc==SQLITE_OK && amt>0 ){
    const u32 ovflSize = pBt->usableSize - 4;  /* Bytes content per ovfl page */
    Pgno nextPage;

    nextPage = get4byte(&aPayload[pCur->info.nLocal]);

    /* If the BtCursor.aOverflow[] has not been allocated, allocate it now.
    **
    ** The aOverflow[] array is sized at one entry for each overflow page
    ** in the overflow chain. The page number of the first overflow page is
    ** stored in aOverflow[0], etc. A value of 0 in the aOverflow[] array
    ** means "not yet known" (the cache is lazily populated).
    */
    if( (pCur->curFlags & BTCF_ValidOvfl)==0 ){
      int nOvfl = (pCur->info.nPayload-pCur->info.nLocal+ovflSize-1)/ovflSize;
      if( pCur->aOverflow==0
       || nOvfl*(int)sizeof(Pgno) > sqlite3MallocSize(pCur->aOverflow)
      ){
        Pgno *aNew;
        if( sqlite3FaultSim(413) ){
          aNew = 0;
        }else{
          aNew = (Pgno*)sqlite3Realloc(pCur->aOverflow, nOvfl*2*sizeof(Pgno));
        }
        if( aNew==0 ){
          return SQLITE_NOMEM_BKPT;
        }else{
          pCur->aOverflow = aNew;
        }
      }
      memset(pCur->aOverflow, 0, nOvfl*sizeof(Pgno));
      pCur->curFlags |= BTCF_ValidOvfl;
    }else{
      /* Sanity check the validity of the overflow page cache */
      assert( pCur->aOverflow[0]==nextPage
           || pCur->aOverflow[0]==0
           || CORRUPT_DB );
      assert( pCur->aOverflow[0]!=0 || pCur->aOverflow[offset/ovflSize]==0 );

      /* If the overflow page-list cache has been allocated and the
      ** entry for the first required overflow page is valid, skip
      ** directly to it.
      */
      if( pCur->aOverflow[offset/ovflSize] ){
        iIdx = (offset/ovflSize);
        nextPage = pCur->aOverflow[iIdx];
        offset = (offset%ovflSize);
      }
    }

    assert( rc==SQLITE_OK && amt>0 );
    while( nextPage ){
      /* If required, populate the overflow page-list cache. */
      if( nextPage > pBt->nPage ) return SQLITE_CORRUPT_BKPT;
      assert( pCur->aOverflow[iIdx]==0
              || pCur->aOverflow[iIdx]==nextPage
              || CORRUPT_DB );
      pCur->aOverflow[iIdx] = nextPage;

      if( offset>=ovflSize ){
        /* The only reason to read this page is to obtain the page
        ** number for the next page in the overflow chain. The page
        ** data is not required. So first try to lookup the overflow
        ** page-list cache, if any, then fall back to the getOverflowPage()
        ** function.
        */
        assert( pCur->curFlags & BTCF_ValidOvfl );
        assert( pCur->pBtree->db==pBt->db );
        if( pCur->aOverflow[iIdx+1] ){
          nextPage = pCur->aOverflow[iIdx+1];
        }else{
          rc = getOverflowPage(pBt, nextPage, 0, &nextPage);
        }
        offset -= ovflSize;
      }else{
        /* Need to read this page properly. It contains some of the
        ** range of data that is being read (eOp==0) or written (eOp!=0).
        */
        int a = amt;
        if( a + offset > ovflSize ){
          a = ovflSize - offset;
        }

#ifdef SQLITE_DIRECT_OVERFLOW_READ
        /* If all the following are true:
        **
        **   1) this is a read operation, and
        **   2) data is required from the start of this overflow page, and
        **   3) there are no dirty pages in the page-cache
        **   4) the database is file-backed, and
        **   5) the page is not in the WAL file
        **   6) at least 4 bytes have already been read into the output buffer
        **
        ** then data can be read directly from the database file into the
        ** output buffer, bypassing the page-cache altogether. This speeds
        ** up loading large records that span many overflow pages.
        */
        if( eOp==0                                             /* (1) */
         && offset==0                                          /* (2) */
         && sqlite3PagerDirectReadOk(pBt->pPager, nextPage)    /* (3,4,5) */
         && &pBuf[-4]>=pBufStart                               /* (6) */
        ){
          sqlite3_file *fd = sqlite3PagerFile(pBt->pPager);
          u8 aSave[4];
          u8 *aWrite = &pBuf[-4];
          assert( aWrite>=pBufStart );                         /* due to (6) */
          memcpy(aSave, aWrite, 4);
          rc = sqlite3OsRead(fd, aWrite, a+4, (i64)pBt->pageSize*(nextPage-1));
          nextPage = get4byte(aWrite);
          memcpy(aWrite, aSave, 4);
        }else
#endif

        {
          DbPage *pDbPage;
          rc = sqlite3PagerGet(pBt->pPager, nextPage, &pDbPage,
              (eOp==0 ? PAGER_GET_READONLY : 0)
          );
          if( rc==SQLITE_OK ){
            aPayload = sqlite3PagerGetData(pDbPage);
            nextPage = get4byte(aPayload);
            rc = copyPayload(&aPayload[offset+4], pBuf, a, eOp, pDbPage);
            sqlite3PagerUnref(pDbPage);
            offset = 0;
          }
        }
        amt -= a;
        if( amt==0 ) return rc;
        pBuf += a;
      }
      if( rc ) break;
      iIdx++;
    }
  }

  if( rc==SQLITE_OK && amt>0 ){
    /* Overflow chain ends prematurely */
    return SQLITE_CORRUPT_PAGE(pPage);
  }
  return rc;
}